

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O0

void __thiscall cmGhsMultiTargetGenerator::Generate(cmGhsMultiTargetGenerator *this)

{
  cmTarget *pcVar1;
  bool bVar2;
  TargetType TVar3;
  int iVar4;
  string *psVar5;
  cmGlobalGhsMultiGenerator *pcVar6;
  undefined4 extraout_var;
  char *pcVar7;
  allocator<char> local_2f9;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  undefined1 local_2a8 [8];
  string msg_1;
  allocator<char> local_1b1;
  undefined1 local_1b0 [8];
  string msg;
  Names local_d0;
  cmGhsMultiTargetGenerator *local_10;
  cmGhsMultiTargetGenerator *this_local;
  
  local_10 = this;
  TVar3 = cmGeneratorTarget::GetType(this->GeneratorTarget);
  switch(TVar3) {
  case EXECUTABLE:
    cmGeneratorTarget::GetExecutableNames(&local_d0,this->GeneratorTarget,&this->ConfigName);
    std::__cxx11::string::operator=((string *)&this->TargetNameReal,(string *)&local_d0.Real);
    cmGeneratorTarget::Names::~Names(&local_d0);
    bVar2 = DetermineIfIntegrityApp(this);
    if (bVar2) {
      this->TagType = INTERGRITY_APPLICATION;
    }
    else {
      this->TagType = PROGRAM;
    }
    break;
  case STATIC_LIBRARY:
    cmGeneratorTarget::GetLibraryNames
              ((Names *)((long)&msg.field_2 + 8),this->GeneratorTarget,&this->ConfigName);
    std::__cxx11::string::operator=
              ((string *)&this->TargetNameReal,(string *)&stack0xfffffffffffffeb0);
    cmGeneratorTarget::Names::~Names((Names *)((long)&msg.field_2 + 8));
    this->TagType = LIBRARY;
    break;
  case SHARED_LIBRARY:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"add_library(<name> SHARED ...) not supported: ",&local_1b1);
    std::allocator<char>::~allocator(&local_1b1);
    std::__cxx11::string::operator+=((string *)local_1b0,(string *)&this->Name);
    cmSystemTools::Message((string *)local_1b0,(char *)0x0);
    std::__cxx11::string::~string((string *)local_1b0);
    return;
  case MODULE_LIBRARY:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2a8,"add_library(<name> MODULE ...) not supported: ",&local_2a9);
    std::allocator<char>::~allocator(&local_2a9);
    std::__cxx11::string::operator+=((string *)local_2a8,(string *)&this->Name);
    cmSystemTools::Message((string *)local_2a8,(char *)0x0);
    std::__cxx11::string::~string((string *)local_2a8);
    return;
  case OBJECT_LIBRARY:
    cmGeneratorTarget::GetLibraryNames
              ((Names *)((long)&msg_1.field_2 + 8),this->GeneratorTarget,&this->ConfigName);
    std::__cxx11::string::operator=
              ((string *)&this->TargetNameReal,(string *)&stack0xfffffffffffffdb8);
    cmGeneratorTarget::Names::~Names((Names *)((long)&msg_1.field_2 + 8));
    this->TagType = SUBPROJECT;
    break;
  case UTILITY:
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this->GeneratorTarget);
    std::__cxx11::string::operator=((string *)&this->TargetNameReal,(string *)psVar5);
    this->TagType = CUSTOM_TARGET;
    break;
  case GLOBAL_TARGET:
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this->GeneratorTarget);
    std::__cxx11::string::operator=((string *)&this->TargetNameReal,(string *)psVar5);
    pcVar6 = GetGlobalGenerator(this);
    iVar4 = (*(pcVar6->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x18])();
    bVar2 = std::operator==(&this->TargetNameReal,(char *)CONCAT44(extraout_var,iVar4));
    if (!bVar2) {
      return;
    }
    this->TagType = CUSTOM_TARGET;
    break;
  default:
    goto switchD_0038acda_default;
  }
  pcVar1 = this->GeneratorTarget->Target;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"GENERATOR_FILE_NAME",&local_2d1);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  cmTarget::SetProperty(pcVar1,&local_2d0,pcVar7);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  pcVar1 = this->GeneratorTarget->Target;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f8,"GENERATOR_FILE_NAME_EXT",&local_2f9);
  pcVar7 = GhsMultiGpj::GetGpjTag(this->TagType);
  cmTarget::SetProperty(pcVar1,&local_2f8,pcVar7);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  GenerateTarget(this);
switchD_0038acda_default:
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::Generate()
{
  // Determine type of target for this project
  switch (this->GeneratorTarget->GetType()) {
    case cmStateEnums::EXECUTABLE: {
      // Get the name of the executable to generate.
      this->TargetNameReal =
        this->GeneratorTarget->GetExecutableNames(this->ConfigName).Real;
      if (cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()) {
        this->TagType = GhsMultiGpj::INTERGRITY_APPLICATION;
      } else {
        this->TagType = GhsMultiGpj::PROGRAM;
      }
      break;
    }
    case cmStateEnums::STATIC_LIBRARY: {
      this->TargetNameReal =
        this->GeneratorTarget->GetLibraryNames(this->ConfigName).Real;
      this->TagType = GhsMultiGpj::LIBRARY;
      break;
    }
    case cmStateEnums::SHARED_LIBRARY: {
      std::string msg = "add_library(<name> SHARED ...) not supported: ";
      msg += this->Name;
      cmSystemTools::Message(msg);
      return;
    }
    case cmStateEnums::OBJECT_LIBRARY: {
      this->TargetNameReal =
        this->GeneratorTarget->GetLibraryNames(this->ConfigName).Real;
      this->TagType = GhsMultiGpj::SUBPROJECT;
      break;
    }
    case cmStateEnums::MODULE_LIBRARY: {
      std::string msg = "add_library(<name> MODULE ...) not supported: ";
      msg += this->Name;
      cmSystemTools::Message(msg);
      return;
    }
    case cmStateEnums::UTILITY: {
      this->TargetNameReal = this->GeneratorTarget->GetName();
      this->TagType = GhsMultiGpj::CUSTOM_TARGET;
      break;
    }
    case cmStateEnums::GLOBAL_TARGET: {
      this->TargetNameReal = this->GeneratorTarget->GetName();
      if (this->TargetNameReal ==
          this->GetGlobalGenerator()->GetInstallTargetName()) {
        this->TagType = GhsMultiGpj::CUSTOM_TARGET;
      } else {
        return;
      }
      break;
    }
    default:
      return;
  }

  // Tell the global generator the name of the project file
  this->GeneratorTarget->Target->SetProperty("GENERATOR_FILE_NAME",
                                             this->Name.c_str());
  this->GeneratorTarget->Target->SetProperty(
    "GENERATOR_FILE_NAME_EXT", GhsMultiGpj::GetGpjTag(this->TagType));

  this->GenerateTarget();
}